

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::IsIgnored
          (MessageDifferencer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer ppIVar1;
  IgnoreCriteria *pIVar2;
  int iVar3;
  iterator iVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  bool bVar7;
  FieldDescriptor *local_40;
  FieldDescriptor *field_local;
  
  local_40 = field;
  field_local = (FieldDescriptor *)parent_fields;
  iVar4 = std::
          _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::find(&(this->ignored_fields_)._M_t,&local_40);
  bVar7 = true;
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->ignored_fields_)._M_t._M_impl.super__Rb_tree_header) {
    uVar6 = 0;
    do {
      ppIVar1 = (this->ignore_criteria_).
                super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(this->ignore_criteria_).
                    super__Vector_base<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::allocator<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1 >> 3;
      bVar7 = uVar6 < uVar5;
      if (uVar5 <= uVar6) {
        return bVar7;
      }
      pIVar2 = ppIVar1[uVar6];
      iVar3 = (*pIVar2->_vptr_IgnoreCriteria[2])(pIVar2,message1,message2,local_40,field_local);
      uVar6 = uVar6 + 1;
    } while ((char)iVar3 == '\0');
  }
  return bVar7;
}

Assistant:

bool MessageDifferencer::IsIgnored(
    const Message& message1, const Message& message2,
    const FieldDescriptor* field,
    const std::vector<SpecificField>& parent_fields) {
  if (ignored_fields_.find(field) != ignored_fields_.end()) {
    return true;
  }
  for (int i = 0; i < ignore_criteria_.size(); ++i) {
    if (ignore_criteria_[i]->IsIgnored(message1, message2, field,
                                       parent_fields)) {
      return true;
    }
  }
  return false;
}